

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

float ncnn::reduction<ncnn::reduction_op_max>(float v0,float *ptr,int size0,int size1,int stride1)

{
  int in_EDX;
  int in_ESI;
  float in_XMM0_Da;
  int j;
  int i;
  float sum;
  reduction_op_max op;
  float *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar1;
  undefined4 local_28;
  undefined4 local_24;
  
  local_24 = in_XMM0_Da;
  for (local_28 = 0; local_28 < in_EDX; local_28 = local_28 + 1) {
    for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
      local_24 = reduction_op_max::operator()
                           ((reduction_op_max *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffc8,(float *)0xf5d9eb);
    }
  }
  return local_24;
}

Assistant:

static float reduction(float v0, const float* ptr, int size0, int size1, int stride1)
{
    Op op;

    float sum = v0;
    for (int i = 0; i < size1; i++)
    {
        for (int j = 0; j < size0; j++)
        {
            sum = op(sum, ptr[j]);
        }
        ptr += stride1;
    }

    return sum;
}